

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

int Sfm_DecExtract(Abc_Ntk_t *pNtk,Sfm_Par_t *pPars,Abc_Obj_t *pPivot,Vec_Int_t *vRoots,
                  Vec_Int_t *vGates,Vec_Wec_t *vFanins,Vec_Int_t *vMap,Vec_Int_t *vTfi,
                  Vec_Int_t *vTfo,Vec_Int_t *vMffc,Vec_Int_t *vInMffc,Sfm_Tim_t *pTim,
                  Sfm_Mit_t *pMit)

{
  int *piVar1;
  int i_00;
  Sfm_Dec_t *pSVar2;
  void *pvVar3;
  Abc_Ntk_t *pNtk_00;
  uint uVar4;
  int iVar5;
  Abc_Obj_t *pAVar6;
  word wVar7;
  Vec_Int_t *pVVar8;
  word wVar9;
  long lVar10;
  int i;
  uint uVar11;
  int iVar12;
  uint uVar13;
  Vec_Int_t *pVVar14;
  ulong uVar15;
  int local_40;
  
  if ((*(uint *)&pPivot->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x625,
                  "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                 );
  }
  uVar11 = *(uint *)&pPivot->field_0x14 >> 0xc;
  uVar4 = uVar11 - pPars->nTfiLevMax;
  iVar12 = pPars->nTfoLevMax;
  vTfo->nSize = 0;
  Abc_NtkIncrementTravId(pNtk);
  Abc_NtkDfsReverseOne_rec(pPivot,vTfo,uVar11 + iVar12,pPars->nFanoutMax);
  for (iVar12 = 0; iVar12 < vTfo->nSize; iVar12 = iVar12 + 1) {
    iVar5 = Vec_IntEntry(vTfo,iVar12);
    pAVar6 = Abc_NtkObj(pNtk,iVar5);
    if (pAVar6 != (Abc_Obj_t *)0x0) {
      for (lVar10 = 0; lVar10 < (pAVar6->vFanins).nSize; lVar10 = lVar10 + 1) {
        piVar1 = (int *)((long)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar10]] + 0x40)
        ;
        *piVar1 = *piVar1 + 1;
      }
    }
  }
  vRoots->nSize = 0;
  for (iVar12 = 0; iVar12 < vTfo->nSize; iVar12 = iVar12 + 1) {
    iVar5 = Vec_IntEntry(vTfo,iVar12);
    pAVar6 = Abc_NtkObj(pNtk,iVar5);
    if ((pAVar6 != (Abc_Obj_t *)0x0) && ((pAVar6->field_6).iTemp != (pAVar6->vFanouts).nSize)) {
      Vec_IntPush(vRoots,pAVar6->Id);
    }
  }
  if (vRoots->nSize < 1) {
    __assert_fail("Vec_IntSize(vRoots) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x635,
                  "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                 );
  }
  vTfi->nSize = 0;
  Abc_NtkIncrementTravId(pNtk);
  iVar5 = 1;
  Abc_NtkDfsOne_rec(pPivot,vTfi,uVar4,1);
  iVar12 = vTfi->nSize;
  pSVar2 = (Sfm_Dec_t *)pPivot->pNtk->pData;
  if (pSVar2->pPars->fUseSim != 0) {
    i_00 = pPivot->Id;
    wVar7 = Sfm_DecObjSim(pSVar2,pPivot);
    Vec_WrdWriteEntry(&pSVar2->vObjSims2,i_00,~wVar7);
  }
  pVVar14 = (Vec_Int_t *)(ulong)uVar4;
  Sfm_DecMarkMffc(pPivot,uVar4,pPars->nMffcMax,iVar5,vMffc,vInMffc,pTim,pMit);
  if (pPars->nMffcMax < vMffc->nSize) {
    __assert_fail("Vec_IntSize(vMffc) <= pPars->nMffcMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x63e,
                  "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                 );
  }
  for (iVar5 = 0; iVar5 < vRoots->nSize; iVar5 = iVar5 + 1) {
    uVar11 = Vec_IntEntry(vRoots,iVar5);
    pVVar14 = (Vec_Int_t *)(ulong)uVar11;
    pAVar6 = Abc_NtkObj(pNtk,uVar11);
    if (pAVar6 != (Abc_Obj_t *)0x0) {
      pVVar14 = vTfi;
      Abc_NtkDfsOne_rec(pAVar6,vTfi,uVar4,2);
    }
  }
  for (; iVar12 < vTfi->nSize; iVar12 = iVar12 + 1) {
    uVar11 = Vec_IntEntry(vTfi,iVar12);
    pVVar14 = (Vec_Int_t *)(ulong)uVar11;
    pAVar6 = Abc_NtkObj(pNtk,uVar11);
    if ((pAVar6 != (Abc_Obj_t *)0x0) && ((pAVar6->field_6).iTemp != 2)) {
      for (lVar10 = 0; lVar10 < (pAVar6->vFanins).nSize; lVar10 = lVar10 + 1) {
        pVVar14 = (Vec_Int_t *)(long)(pAVar6->vFanins).pArray[lVar10];
        pvVar3 = pAVar6->pNtk->vObjs->pArray[(long)pVVar14];
        if (*(int *)((long)pvVar3 + 0x40) == 2) {
          *(undefined4 *)((long)pvVar3 + 0x40) = 4;
        }
      }
    }
  }
  vMap->nSize = 0;
  vGates->nSize = 0;
  for (iVar12 = 0; iVar5 = vTfi->nSize, iVar12 < iVar5; iVar12 = iVar12 + 1) {
    uVar11 = Vec_IntEntry(vTfi,iVar12);
    pVVar14 = (Vec_Int_t *)(ulong)uVar11;
    pAVar6 = Abc_NtkObj(pNtk,uVar11);
    if ((pAVar6 != (Abc_Obj_t *)0x0) && ((pAVar6->field_6).iTemp == 1)) {
      uVar13 = *(uint *)&pAVar6->field_0x14 & 0xf;
      uVar11 = 1;
      if ((uVar13 != 2) &&
         ((uVar13 != 5 && (uVar11 = 0, (int)(*(uint *)&pAVar6->field_0x14 >> 0xc) < (int)uVar4)))) {
        uVar11 = (uint)(0 < (pAVar6->vFanins).nSize);
      }
      pVVar14 = vMap;
      Sfm_DecAddNode(pAVar6,vMap,vGates,uVar11,0);
    }
  }
  local_40 = vMap->nSize;
  for (iVar12 = 0; iVar12 < iVar5; iVar12 = iVar12 + 1) {
    uVar11 = Vec_IntEntry(vTfi,iVar12);
    pVVar14 = (Vec_Int_t *)(ulong)uVar11;
    pAVar6 = Abc_NtkObj(pNtk,uVar11);
    if ((pAVar6 != (Abc_Obj_t *)0x0) && ((pAVar6->field_6).iTemp - 3U < 2)) {
      pVVar14 = vMap;
      Sfm_DecAddNode(pAVar6,vMap,vGates,(uint)((pAVar6->field_6).iTemp == 4),0);
    }
    iVar5 = vTfi->nSize;
  }
  if (pMit == (Sfm_Mit_t *)0x0) {
    if (pTim != (Sfm_Tim_t *)0x0) {
      iVar12 = vMap->nSize;
      vTfo->nSize = 0;
      Vec_IntAppend(vTfo,vMap);
      pVVar14 = vTfo;
      local_40 = Sfm_TimSortArrayByArrival(pTim,vTfo,pPivot->Id);
      vMap->nSize = 0;
      vGates->nSize = 0;
      for (iVar5 = 0; iVar5 < vTfo->nSize; iVar5 = iVar5 + 1) {
        uVar11 = Vec_IntEntry(vTfo,iVar5);
        pVVar14 = (Vec_Int_t *)(ulong)uVar11;
        pAVar6 = Abc_NtkObj(pNtk,uVar11);
        if (pAVar6 != (Abc_Obj_t *)0x0) {
          uVar13 = *(uint *)&pAVar6->field_0x14 & 0xf;
          uVar11 = 1;
          if (((uVar13 != 2) && (uVar11 = 1, uVar13 != 5)) &&
             (((int)uVar4 <= (int)(*(uint *)&pAVar6->field_0x14 >> 0xc) ||
              (uVar11 = 1, (pAVar6->vFanins).nSize < 1)))) {
            uVar11 = (uint)((pAVar6->field_6).iTemp == 4);
          }
          pVVar14 = vMap;
          Sfm_DecAddNode(pAVar6,vMap,vGates,uVar11,0);
        }
      }
      if (iVar12 != vMap->nSize) {
        __assert_fail("nOldSize == Vec_IntSize(vMap)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                      ,0x674,
                      "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                     );
      }
    }
  }
  else {
    iVar12 = vMap->nSize;
    vTfo->nSize = 0;
    Vec_IntAppend(vTfo,vMap);
    pVVar14 = vTfo;
    local_40 = Sfm_MitSortArrayByArrival(pMit,vTfo,pPivot->Id);
    vMap->nSize = 0;
    vGates->nSize = 0;
    for (iVar5 = 0; iVar5 < vTfo->nSize; iVar5 = iVar5 + 1) {
      uVar11 = Vec_IntEntry(vTfo,iVar5);
      pVVar14 = (Vec_Int_t *)(ulong)uVar11;
      pAVar6 = Abc_NtkObj(pNtk,uVar11);
      if (pAVar6 != (Abc_Obj_t *)0x0) {
        uVar13 = *(uint *)&pAVar6->field_0x14 & 0xf;
        uVar11 = 1;
        if (((uVar13 != 2) && (uVar11 = 1, uVar13 != 5)) &&
           (((int)uVar4 <= (int)(*(uint *)&pAVar6->field_0x14 >> 0xc) ||
            (uVar11 = 1, (pAVar6->vFanins).nSize < 1)))) {
          uVar11 = (uint)((pAVar6->field_6).iTemp == 4);
        }
        pVVar14 = vMap;
        Sfm_DecAddNode(pAVar6,vMap,vGates,uVar11,0);
      }
    }
    if (iVar12 != vMap->nSize) {
      __assert_fail("nOldSize == Vec_IntSize(vMap)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                    ,0x665,
                    "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                   );
    }
  }
  for (iVar12 = 0; iVar12 < vTfi->nSize; iVar12 = iVar12 + 1) {
    uVar4 = Vec_IntEntry(vTfi,iVar12);
    pVVar14 = (Vec_Int_t *)(ulong)uVar4;
    pAVar6 = Abc_NtkObj(pNtk,uVar4);
    if ((pAVar6 != (Abc_Obj_t *)0x0) && (7 < (pAVar6->field_6).iTemp)) {
      pVVar14 = vMap;
      Sfm_DecAddNode(pAVar6,vMap,vGates,0,0);
    }
  }
  if (vMap->nSize != vGates->nSize) {
    __assert_fail("Vec_IntSize(vMap) == Vec_IntSize(vGates)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x67e,
                  "int Sfm_DecExtract(Abc_Ntk_t *, Sfm_Par_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                 );
  }
  for (uVar4 = 0; (int)uVar4 < vFanins->nSize; uVar4 = uVar4 + 1) {
    pVVar14 = (Vec_Int_t *)(ulong)uVar4;
    pVVar8 = Vec_WecEntry(vFanins,uVar4);
    pVVar8->nSize = 0;
  }
  vFanins->nSize = 0;
  uVar4 = 0;
  do {
    if (vMap->nSize <= (int)uVar4) {
      pNtk_00 = pPivot->pNtk;
      pAVar6 = Abc_NtkPi(pNtk_00,(int)pVVar14);
      pSVar2 = (Sfm_Dec_t *)pAVar6->pNtk->pData;
      iVar12 = 0;
      if (pSVar2->pPars->fUseSim == 0) {
        uVar15 = 0;
      }
      else {
        uVar15 = 0;
        for (; iVar12 < vRoots->nSize; iVar12 = iVar12 + 1) {
          iVar5 = Vec_IntEntry(vRoots,iVar12);
          pAVar6 = Abc_NtkObj(pNtk_00,iVar5);
          if (pAVar6 != (Abc_Obj_t *)0x0) {
            wVar7 = Sfm_DecObjSim(pSVar2,pAVar6);
            wVar9 = Sfm_DecObjSim2(pSVar2,pAVar6);
            uVar15 = uVar15 | wVar9 ^ wVar7;
          }
        }
      }
      *(ulong *)((long)pPivot->pNtk->pData + 200) = uVar15;
      for (iVar12 = 0; iVar12 < vRoots->nSize; iVar12 = iVar12 + 1) {
        iVar5 = Vec_IntEntry(vRoots,iVar12);
        pAVar6 = Abc_NtkObj(pNtk,iVar5);
        if (pAVar6 != (Abc_Obj_t *)0x0) {
          Vec_IntWriteEntry(vRoots,iVar12,(pAVar6->field_6).iTemp);
        }
      }
      for (iVar12 = 0; iVar12 < vInMffc->nSize; iVar12 = iVar12 + 1) {
        iVar5 = Vec_IntEntry(vInMffc,iVar12);
        pAVar6 = Abc_NtkObj(pNtk,iVar5);
        if (pAVar6 != (Abc_Obj_t *)0x0) {
          Vec_IntWriteEntry(vInMffc,iVar12,(pAVar6->field_6).iTemp);
        }
      }
      return local_40;
    }
    uVar11 = Vec_IntEntry(vMap,uVar4);
    pVVar14 = (Vec_Int_t *)(ulong)uVar11;
    pAVar6 = Abc_NtkObj(pNtk,uVar11);
    if (pAVar6 != (Abc_Obj_t *)0x0) {
      (pAVar6->field_6).iTemp = uVar4;
      iVar12 = vFanins->nSize;
      if (iVar12 == vFanins->nCap) {
        uVar11 = iVar12 * 2;
        if (iVar12 < 0x10) {
          uVar11 = 0x10;
        }
        if (iVar12 < (int)uVar11) {
          if (vFanins->pArray == (Vec_Int_t *)0x0) {
            pVVar14 = (Vec_Int_t *)malloc((ulong)uVar11 << 4);
            iVar5 = iVar12;
          }
          else {
            pVVar14 = (Vec_Int_t *)realloc(vFanins->pArray,(ulong)uVar11 << 4);
            iVar12 = vFanins->nSize;
            iVar5 = vFanins->nCap;
          }
          vFanins->pArray = pVVar14;
          memset(pVVar14 + iVar5,0,(long)(int)(uVar11 - iVar5) << 4);
          vFanins->nCap = uVar11;
        }
      }
      vFanins->nSize = iVar12 + 1U;
      if (iVar12 < 0) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
      }
      pVVar8 = vFanins->pArray;
      pVVar14 = (Vec_Int_t *)(ulong)uVar4;
      iVar5 = Vec_IntEntry(vGates,uVar4);
      if (-1 < iVar5) {
        for (lVar10 = 0; lVar10 < (pAVar6->vFanins).nSize; lVar10 = lVar10 + 1) {
          uVar11 = *(uint *)((long)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar10]] +
                            0x40);
          pVVar14 = (Vec_Int_t *)(ulong)uVar11;
          Vec_IntPush(pVVar8 + ((ulong)(iVar12 + 1U) - 1),uVar11);
        }
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int Sfm_DecExtract( Abc_Ntk_t * pNtk, Sfm_Par_t * pPars, Abc_Obj_t * pPivot, Vec_Int_t * vRoots, Vec_Int_t * vGates, Vec_Wec_t * vFanins, Vec_Int_t * vMap, Vec_Int_t * vTfi, Vec_Int_t * vTfo, Vec_Int_t * vMffc, Vec_Int_t * vInMffc, Sfm_Tim_t * pTim, Sfm_Mit_t * pMit )
{
    int fVeryVerbose = 0;//pPars->fVeryVerbose;
    Vec_Int_t * vLevel;
    Abc_Obj_t * pObj, * pFanin;
    int nLevelMax = pPivot->Level + pPars->nTfoLevMax;
    int nLevelMin = pPivot->Level - pPars->nTfiLevMax;
    int i, k, nTfiSize, nDivs = -1;
    assert( Abc_ObjIsNode(pPivot) );
if ( fVeryVerbose )
printf( "\n\nTarget %d\n", Abc_ObjId(pPivot) );
    // collect TFO nodes
    Vec_IntClear( vTfo );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkDfsReverseOne_rec( pPivot, vTfo, nLevelMax, pPars->nFanoutMax );
    // count internal fanouts
    Abc_NtkForEachObjVec( vTfo, pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            pFanin->iTemp++;
    // compute roots
    Vec_IntClear( vRoots );
    Abc_NtkForEachObjVec( vTfo, pNtk, pObj, i )
        if ( pObj->iTemp != Abc_ObjFanoutNum(pObj) )
            Vec_IntPush( vRoots, Abc_ObjId(pObj) );
    assert( Vec_IntSize(vRoots) > 0 );
    // collect TFI and mark nodes
    Vec_IntClear( vTfi );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkDfsOne_rec( pPivot, vTfi, nLevelMin, SFM_MASK_PI );
    nTfiSize = Vec_IntSize(vTfi);
    Sfm_ObjFlipNode( pPivot );
    // additinally mark MFFC
    Sfm_DecMarkMffc( pPivot, nLevelMin, pPars->nMffcMax, fVeryVerbose, vMffc, vInMffc, pTim, pMit );
    assert( Vec_IntSize(vMffc) <= pPars->nMffcMax );
if ( fVeryVerbose )
printf( "Mffc size = %d. Mffc area = %.2f. InMffc size = %d.\n", Vec_IntSize(vMffc), Scl_Int2Flt(Sfm_DecMffcArea(pNtk, vMffc)), Vec_IntSize(vInMffc) );
    // collect TFI(TFO)
    Abc_NtkForEachObjVec( vRoots, pNtk, pObj, i )
        Abc_NtkDfsOne_rec( pObj, vTfi, nLevelMin, SFM_MASK_INPUT );
    // mark input-only nodes pointed to by mixed nodes
    Abc_NtkForEachObjVecStart( vTfi, pNtk, pObj, i, nTfiSize )
        if ( pObj->iTemp != SFM_MASK_INPUT )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                if ( pFanin->iTemp == SFM_MASK_INPUT )
                    pFanin->iTemp = SFM_MASK_FANIN;
    // collect nodes supported only on TFI fanins and not MFFC
if ( fVeryVerbose )
printf( "\nDivs:\n" );
    Vec_IntClear( vMap );
    Vec_IntClear( vGates );
    Abc_NtkForEachObjVec( vTfi, pNtk, pObj, i )
        if ( pObj->iTemp == SFM_MASK_PI )
            Sfm_DecAddNode( pObj, vMap, vGates, Abc_ObjIsCi(pObj) || (Abc_ObjLevel(pObj) < nLevelMin && Abc_ObjFaninNum(pObj) > 0), fVeryVerbose );
    nDivs = Vec_IntSize(vMap);
    // add other nodes that are not in TFO and not in MFFC
if ( fVeryVerbose )
printf( "\nSides:\n" );
    Abc_NtkForEachObjVec( vTfi, pNtk, pObj, i )
        if ( pObj->iTemp == (SFM_MASK_PI | SFM_MASK_INPUT) || pObj->iTemp == SFM_MASK_FANIN )
            Sfm_DecAddNode( pObj, vMap, vGates, pObj->iTemp == SFM_MASK_FANIN, fVeryVerbose );
    // reorder nodes acording to delay
    if ( pMit )
    {
        int nDivsNew, nOldSize = Vec_IntSize(vMap);
        Vec_IntClear( vTfo );
        Vec_IntAppend( vTfo, vMap );
        nDivsNew = Sfm_MitSortArrayByArrival( pMit, vTfo, Abc_ObjId(pPivot) );
        // collect again
        Vec_IntClear( vMap );
        Vec_IntClear( vGates );
        Abc_NtkForEachObjVec( vTfo, pNtk, pObj, i )
            Sfm_DecAddNode( pObj, vMap, vGates, Abc_ObjIsCi(pObj) || (Abc_ObjLevel(pObj) < nLevelMin && Abc_ObjFaninNum(pObj) > 0) || pObj->iTemp == SFM_MASK_FANIN, 0 );
        assert( nOldSize == Vec_IntSize(vMap) );
        // update divisor count
        nDivs = nDivsNew;
    }
    else if ( pTim )
    {
        int nDivsNew, nOldSize = Vec_IntSize(vMap);
        Vec_IntClear( vTfo );
        Vec_IntAppend( vTfo, vMap );
        nDivsNew = Sfm_TimSortArrayByArrival( pTim, vTfo, Abc_ObjId(pPivot) );
        // collect again
        Vec_IntClear( vMap );
        Vec_IntClear( vGates );
        Abc_NtkForEachObjVec( vTfo, pNtk, pObj, i )
            Sfm_DecAddNode( pObj, vMap, vGates, Abc_ObjIsCi(pObj) || (Abc_ObjLevel(pObj) < nLevelMin && Abc_ObjFaninNum(pObj) > 0) || pObj->iTemp == SFM_MASK_FANIN, 0 );
        assert( nOldSize == Vec_IntSize(vMap) );
        // update divisor count
        nDivs = nDivsNew;
    }
    // add the TFO nodes
if ( fVeryVerbose )
printf( "\nTFO:\n" );
    Abc_NtkForEachObjVec( vTfi, pNtk, pObj, i )
        if ( pObj->iTemp >= SFM_MASK_MFFC )
            Sfm_DecAddNode( pObj, vMap, vGates, 0, fVeryVerbose );
    assert( Vec_IntSize(vMap) == Vec_IntSize(vGates) );
if ( fVeryVerbose )
printf( "\n" );
    // create node IDs
    Vec_WecClear( vFanins );
    Abc_NtkForEachObjVec( vMap, pNtk, pObj, i )
    {
        pObj->iTemp = i;
        vLevel = Vec_WecPushLevel( vFanins );
        if ( Vec_IntEntry(vGates, i) >= 0 )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Vec_IntPush( vLevel, pFanin->iTemp );
    }
    // compute care set
    Sfm_DecMan(pPivot)->uCareSet = Sfm_ObjFindCareSet(pPivot->pNtk, vRoots);

    //printf( "care = %5d : ", Abc_ObjId(pPivot) );
    //Extra_PrintBinary( stdout, (unsigned *)&Sfm_DecMan(pPivot)->uCareSet, 64 );
    //printf( "\n" );

    // remap roots
    Abc_NtkForEachObjVec( vRoots, pNtk, pObj, i )
        Vec_IntWriteEntry( vRoots, i, pObj->iTemp );
    // remap inputs to MFFC
    Abc_NtkForEachObjVec( vInMffc, pNtk, pObj, i )
        Vec_IntWriteEntry( vInMffc, i, pObj->iTemp );

/*
    // check
    Abc_NtkForEachObjVec( vMap, pNtk, pObj, i )
    {
        if ( i == nDivs )
            break;
        Abc_NtkIncrementTravId( pNtk );
        assert( Abc_NtkDfsCheck_rec(pObj, pPivot) );
    }
*/  
    return nDivs;
}